

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTiming.c
# Opt level: O0

void Aig_ManVerifyReverseLevel(Aig_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Aig_Obj_t *pObj_00;
  uint local_20;
  int local_1c;
  int Counter;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  local_20 = 0;
  if (p->vLevelR == (Vec_Int_t *)0x0) {
    __assert_fail("p->vLevelR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTiming.c"
                  ,0x152,"void Aig_ManVerifyReverseLevel(Aig_Man_t *)");
  }
  for (local_1c = 0; iVar2 = Vec_PtrSize(p->vObjs), local_1c < iVar2; local_1c = local_1c + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_1c);
    if ((pObj_00 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pObj_00), iVar2 != 0)) {
      iVar2 = Aig_ObjLevel(pObj_00);
      iVar3 = Aig_ObjLevelNew(pObj_00);
      if (iVar2 != iVar3) {
        uVar1 = pObj_00->Id;
        uVar4 = Aig_ObjReverseLevelNew(p,pObj_00);
        uVar5 = Aig_ObjReverseLevel(p,pObj_00);
        printf("Reverse level of node %6d should be %4d instead of %4d.\n",(ulong)uVar1,(ulong)uVar4
               ,(ulong)uVar5);
        local_20 = local_20 + 1;
      }
    }
  }
  if (local_20 != 0) {
    printf("Reverse levels of %d nodes are incorrect.\n",(ulong)local_20);
  }
  return;
}

Assistant:

void Aig_ManVerifyReverseLevel( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    assert( p->vLevelR );
    Aig_ManForEachNode( p, pObj, i )
        if ( Aig_ObjLevel(pObj) != Aig_ObjLevelNew(pObj) )
        {
            printf( "Reverse level of node %6d should be %4d instead of %4d.\n", 
                pObj->Id, Aig_ObjReverseLevelNew(p, pObj), Aig_ObjReverseLevel(p, pObj) );
            Counter++;
        }
    if ( Counter )
    printf( "Reverse levels of %d nodes are incorrect.\n", Counter );
}